

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O3

Method * __thiscall
capnp::InterfaceSchema::getMethodByName
          (Method *__return_storage_ptr__,InterfaceSchema *this,StringPtr name)

{
  uint counter;
  StringPtr name_local;
  Fault f;
  anon_union_64_1_a8c68091_for_NullableValue<capnp::InterfaceSchema::Method>_2 local_98 [2];
  
  name_local.content.size_ = name.content.size_;
  name_local.content.ptr = name.content.ptr;
  counter = 0;
  findMethodByName((Maybe<capnp::InterfaceSchema::Method> *)&f,this,name,&counter);
  if ((char)f.exception == '\x01') {
    (__return_storage_ptr__->proto)._reader.dataSize = local_98[0]._48_4_;
    (__return_storage_ptr__->proto)._reader.pointerCount = local_98[0]._52_2_;
    *(undefined2 *)&(__return_storage_ptr__->proto)._reader.field_0x26 = local_98[0]._54_2_;
    *(undefined8 *)&(__return_storage_ptr__->proto)._reader.nestingLimit = local_98[0]._56_8_;
    (__return_storage_ptr__->proto)._reader.data = (void *)local_98[0]._32_8_;
    (__return_storage_ptr__->proto)._reader.pointers = (WirePointer *)local_98[0]._40_8_;
    (__return_storage_ptr__->proto)._reader.segment = (SegmentReader *)local_98[0]._16_8_;
    (__return_storage_ptr__->proto)._reader.capTable = (CapTableReader *)local_98[0]._24_8_;
    (__return_storage_ptr__->parent).super_Schema.raw = (RawBrandedSchema *)local_98[0]._0_8_;
    *(undefined8 *)&__return_storage_ptr__->ordinal = local_98[0]._8_8_;
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[29],kj::StringPtr&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
             ,0x26c,FAILED,(char *)0x0,"\"interface has no such method\", name",
             (char (*) [29])"interface has no such method",&name_local);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

InterfaceSchema::Method InterfaceSchema::getMethodByName(kj::StringPtr name) const {
  KJ_IF_SOME(method, findMethodByName(name)) {
    return method;
  } else {
    KJ_FAIL_REQUIRE("interface has no such method", name);
  }
}